

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O2

bool GlobOpt::NeedsTypeCheckBailOut
               (Instr *instr,PropertySymOpnd *propertySymOpnd,bool isStore,
               bool *pIsTypeCheckProtected,BailOutKind *pBailOutKind)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  BailOutKind BVar7;
  undefined4 *puVar8;
  BailOutKind BVar9;
  
  OVar1 = instr->m_opcode;
  if (OVar1 == LdMethodFldPolyInlineMiss) {
    return false;
  }
  if (OVar1 == CheckPropertyGuardAndLoadType) {
    return false;
  }
  if ((OVar1 == CheckFixedFld) &&
     ((((ushort)propertySymOpnd->field_12 & 2) == 0 ||
      (bVar3 = IR::PropertySymOpnd::MayNeedTypeCheckProtection(propertySymOpnd), !bVar3)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x5a4,
                       "(instr->m_opcode != Js::OpCode::CheckFixedFld || (propertySymOpnd->UsesFixedValue() && propertySymOpnd->MayNeedTypeCheckProtection()))"
                       ,
                       "instr->m_opcode != Js::OpCode::CheckFixedFld || (propertySymOpnd->UsesFixedValue() && propertySymOpnd->MayNeedTypeCheckProtection())"
                      );
    if (!bVar3) goto LAB_00460705;
    *puVar8 = 0;
  }
  bVar3 = IR::PropertySymOpnd::MayNeedTypeCheckProtection(propertySymOpnd);
  OVar1 = instr->m_opcode;
  if (!bVar3) {
    BVar7 = BailOutInvalid;
    bVar3 = false;
    if (OVar1 == CheckFixedFld) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x5bf,"(instr->m_opcode != Js::OpCode::CheckFixedFld)",
                         "instr->m_opcode != Js::OpCode::CheckFixedFld");
      if (bVar3) {
        *puVar8 = 0;
        BVar7 = BailOutInvalid;
        bVar3 = false;
        goto LAB_004606f1;
      }
      goto LAB_00460705;
    }
    goto LAB_004606f1;
  }
  if (OVar1 == CheckFixedFld) {
    uVar5 = Func::GetSourceContextId(instr->m_func);
    uVar6 = Func::GetLocalFunctionId(instr->m_func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,FixedMethodsPhase,uVar5,uVar6);
    if (bVar3) {
      uVar5 = Func::GetSourceContextId(instr->m_func);
      uVar6 = Func::GetLocalFunctionId(instr->m_func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,UseFixedDataPropsPhase,uVar5,uVar6);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x5aa,
                           "(!isCheckFixedFld || !Js::Configuration::Global.flags.Off.IsEnabled(((Js::FixedMethodsPhase)), ((instr->m_func)->GetSourceContextId()), ((instr->m_func)->GetLocalFunctionId())) || !Js::Configuration::Global.flags.Off.IsEnabled(((Js::UseFixedDataPropsPhase)), ((instr->m_func)->GetSourceContextId()), ((instr->m_func)->GetLocalFunctionId())))"
                           ,"CheckFixedFld with fixed method/data phase disabled?");
        if (!bVar3) goto LAB_00460705;
        *puVar8 = 0;
      }
    }
    if (isStore) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x5ab,"(!isStore || !isCheckFixedFld)","!isStore || !isCheckFixedFld");
      if (!bVar3) goto LAB_00460705;
      *puVar8 = 0;
LAB_00460642:
      bVar3 = IR::PropertySymOpnd::IsLoadedFromProto(propertySymOpnd);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x5ad,"(!isStore || !propertySymOpnd->IsLoadedFromProto())",
                           "!isStore || !propertySymOpnd->IsLoadedFromProto()");
        if (!bVar3) {
LAB_00460705:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
    }
  }
  else if (isStore) goto LAB_00460642;
  bVar3 = IR::PropertySymOpnd::NeedsTypeCheckAndBailOut(propertySymOpnd);
  if (bVar3) {
    bVar4 = IR::PropertySymOpnd::HasEquivalentTypeSet(propertySymOpnd);
    if ((!bVar4) || (bVar4 = IR::PropertySymOpnd::MustDoMonoCheck(propertySymOpnd), bVar4)) {
      BVar9 = BailOutFailedFixedFieldTypeCheck;
      BVar7 = BailOutFailedTypeCheck;
    }
    else {
      BVar9 = BailOutFailedEquivalentFixedFieldTypeCheck;
      BVar7 = BailOutFailedEquivalentTypeCheck;
    }
    if (OVar1 == CheckFixedFld) {
      BVar7 = BVar9;
    }
  }
  else {
    bVar4 = IR::PropertySymOpnd::IsTypeCheckProtected(propertySymOpnd);
    *pIsTypeCheckProtected = bVar4;
    BVar7 = BailOutInvalid;
  }
LAB_004606f1:
  *pBailOutKind = BVar7;
  return bVar3;
}

Assistant:

bool
GlobOpt::NeedsTypeCheckBailOut(const IR::Instr *instr, IR::PropertySymOpnd *propertySymOpnd, bool isStore, bool* pIsTypeCheckProtected, IR::BailOutKind *pBailOutKind)
{
    if (instr->m_opcode == Js::OpCode::CheckPropertyGuardAndLoadType || instr->m_opcode == Js::OpCode::LdMethodFldPolyInlineMiss)
    {
        return false;
    }
    // CheckFixedFld always requires a type check and bailout either at the instruction or upstream.
    Assert(instr->m_opcode != Js::OpCode::CheckFixedFld || (propertySymOpnd->UsesFixedValue() && propertySymOpnd->MayNeedTypeCheckProtection()));

    if (propertySymOpnd->MayNeedTypeCheckProtection())
    {
        bool isCheckFixedFld = instr->m_opcode == Js::OpCode::CheckFixedFld;
        AssertMsg(!isCheckFixedFld || !PHASE_OFF(Js::FixedMethodsPhase, instr->m_func) ||
            !PHASE_OFF(Js::UseFixedDataPropsPhase, instr->m_func), "CheckFixedFld with fixed method/data phase disabled?");
        Assert(!isStore || !isCheckFixedFld);
        // We don't share caches between field loads and stores.  We should never have a field store involving a proto cache.
        Assert(!isStore || !propertySymOpnd->IsLoadedFromProto());

        if (propertySymOpnd->NeedsTypeCheckAndBailOut())
        {
            *pBailOutKind = propertySymOpnd->HasEquivalentTypeSet() && !propertySymOpnd->MustDoMonoCheck() ?
                (isCheckFixedFld ? IR::BailOutFailedEquivalentFixedFieldTypeCheck : IR::BailOutFailedEquivalentTypeCheck) :
                (isCheckFixedFld ? IR::BailOutFailedFixedFieldTypeCheck : IR::BailOutFailedTypeCheck);
            return true;
        }
        else
        {
            *pIsTypeCheckProtected = propertySymOpnd->IsTypeCheckProtected();
            *pBailOutKind = IR::BailOutInvalid;
            return false;
        }
    }
    else
    {
        Assert(instr->m_opcode != Js::OpCode::CheckFixedFld);
        *pBailOutKind = IR::BailOutInvalid;
        return false;
    }
}